

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TikzPlotter.cpp
# Opt level: O0

void __thiscall vectorgraphics::TikzPlotter::addPoint(TikzPlotter *this,Point2D *point_2d)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  bool bVar1;
  vector<std::shared_ptr<vectorgraphics::Style>,_std::allocator<std::shared_ptr<vectorgraphics::Style>_>_>
  *this_00;
  element_type *peVar2;
  ostream *poVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_3e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_3c8;
  bool local_2d9;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2ac;
  undefined1 local_2ab;
  allocator<char> local_2aa;
  allocator<char> local_2a9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  string local_280 [32];
  iterator local_260;
  size_type local_258;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_250;
  string local_238;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_218;
  undefined1 local_217;
  allocator<char> local_216;
  allocator<char> local_215;
  allocator<char> local_214;
  allocator<char> local_213;
  allocator<char> local_212;
  allocator<char> local_211;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  string local_1e8 [32];
  string local_1c8 [32];
  string local_1a8 [32];
  string local_188 [32];
  string local_168 [32];
  iterator local_148;
  size_type local_140;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_138;
  string local_120;
  _Self local_100;
  byte local_f3;
  byte local_f2;
  allocator<char> local_f1;
  key_type local_f0;
  _Self local_d0;
  _Self local_c8;
  allocator<char> local_b9;
  key_type local_b8;
  _Self local_98 [3];
  vector<std::shared_ptr<vectorgraphics::Flag>,_std::allocator<std::shared_ptr<vectorgraphics::Flag>_>_>
  local_80;
  __shared_ptr_access<vectorgraphics::Style,_(__gnu_cxx::_Lock_policy)2,_false,_false> *local_68;
  shared_ptr<vectorgraphics::Style> *style_ptr;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::shared_ptr<vectorgraphics::Style>,_std::allocator<std::shared_ptr<vectorgraphics::Style>_>_>
  *__range1;
  StyleMap style_map;
  Point2D *point_2d_local;
  TikzPlotter *this_local;
  
  style_map._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)point_2d;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)&__range1);
  this_00 = (vector<std::shared_ptr<vectorgraphics::Style>,_std::allocator<std::shared_ptr<vectorgraphics::Style>_>_>
             *)(style_map._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x18);
  __end1 = std::
           vector<std::shared_ptr<vectorgraphics::Style>,_std::allocator<std::shared_ptr<vectorgraphics::Style>_>_>
           ::begin(this_00);
  style_ptr = (shared_ptr<vectorgraphics::Style> *)
              std::
              vector<std::shared_ptr<vectorgraphics::Style>,_std::allocator<std::shared_ptr<vectorgraphics::Style>_>_>
              ::end(this_00);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_std::shared_ptr<vectorgraphics::Style>_*,_std::vector<std::shared_ptr<vectorgraphics::Style>,_std::allocator<std::shared_ptr<vectorgraphics::Style>_>_>_>
                                     *)&style_ptr), bVar1) {
    local_68 = (__shared_ptr_access<vectorgraphics::Style,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)__gnu_cxx::
                  __normal_iterator<const_std::shared_ptr<vectorgraphics::Style>_*,_std::vector<std::shared_ptr<vectorgraphics::Style>,_std::allocator<std::shared_ptr<vectorgraphics::Style>_>_>_>
                  ::operator*(&__end1);
    peVar2 = std::
             __shared_ptr_access<vectorgraphics::Style,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(local_68);
    std::
    vector<std::shared_ptr<vectorgraphics::Flag>,_std::allocator<std::shared_ptr<vectorgraphics::Flag>_>_>
    ::vector(&local_80,
             (vector<std::shared_ptr<vectorgraphics::Flag>,_std::allocator<std::shared_ptr<vectorgraphics::Flag>_>_>
              *)style_map._M_t._M_impl.super__Rb_tree_header._M_node_count);
    bVar1 = Style::conditionFulfilled(peVar2,&local_80);
    std::
    vector<std::shared_ptr<vectorgraphics::Flag>,_std::allocator<std::shared_ptr<vectorgraphics::Flag>_>_>
    ::~vector(&local_80);
    if (bVar1) {
      peVar2 = std::
               __shared_ptr_access<vectorgraphics::Style,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->(local_68);
      Style::applyStyle(peVar2,(StyleMap *)&__range1);
    }
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<vectorgraphics::Style>_*,_std::vector<std::shared_ptr<vectorgraphics::Style>,_std::allocator<std::shared_ptr<vectorgraphics::Style>_>_>_>
    ::operator++(&__end1);
  }
  std::allocator<char>::allocator();
  local_f2 = 0;
  local_f3 = 0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"draw",&local_b9);
  local_98[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&__range1,&local_b8);
  local_c8._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&__range1);
  bVar1 = std::operator!=(local_98,&local_c8);
  local_2d9 = true;
  if (!bVar1) {
    std::allocator<char>::allocator();
    local_f2 = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,"fill",&local_f1);
    local_f3 = 1;
    local_d0._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&__range1,&local_f0);
    local_100._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&__range1);
    local_2d9 = std::operator!=(&local_d0,&local_100);
  }
  if ((local_f3 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_f0);
  }
  if ((local_f2 & 1) != 0) {
    std::allocator<char>::~allocator(&local_f1);
  }
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator(&local_b9);
  if (local_2d9 != false) {
    poVar3 = std::operator<<((ostream *)&this->field_0x10,"\\path[");
    local_217 = 1;
    local_210 = &local_208;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_208,"draw",&local_211);
    local_210 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_1e8,"draw opacity",&local_212);
    local_210 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_1c8,"fill",&local_213);
    local_210 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_1a8,"fill opacity",&local_214);
    local_210 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_188;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_188,"line width",&local_215);
    local_210 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_168;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_168,"*point_path",&local_216);
    local_217 = 0;
    local_148 = &local_208;
    local_140 = 6;
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::allocator(&local_218);
    __l_00._M_len = local_140;
    __l_00._M_array = local_148;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_138,__l_00,&local_218);
    getStyleMapString(&local_120,(StyleMap *)&__range1,&local_138);
    poVar3 = std::operator<<(poVar3,(string *)&local_120);
    poVar3 = std::operator<<(poVar3,"] ");
    poVar3 = operator<<(poVar3,(Point2D *)style_map._M_t._M_impl.super__Rb_tree_header._M_node_count
                       );
    poVar3 = std::operator<<(poVar3,"circle [");
    local_2ab = 1;
    local_2a8 = &local_2a0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a0,"radius",&local_2a9);
    local_2a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_280;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_280,"*point_circle",&local_2aa);
    local_2ab = 0;
    local_260 = &local_2a0;
    local_258 = 2;
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::allocator(&local_2ac);
    __l._M_len = local_258;
    __l._M_array = local_260;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_250,__l,&local_2ac);
    getStyleMapString(&local_238,(StyleMap *)&__range1,&local_250);
    poVar3 = std::operator<<(poVar3,(string *)&local_238);
    poVar3 = std::operator<<(poVar3,"];");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_238);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_250);
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~allocator(&local_2ac);
    local_3c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_260;
    do {
      local_3c8 = local_3c8 + -1;
      std::__cxx11::string::~string((string *)local_3c8);
    } while (local_3c8 != &local_2a0);
    std::allocator<char>::~allocator(&local_2aa);
    std::allocator<char>::~allocator(&local_2a9);
    std::__cxx11::string::~string((string *)&local_120);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_138);
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~allocator(&local_218);
    local_3e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_148;
    do {
      local_3e0 = local_3e0 + -1;
      std::__cxx11::string::~string((string *)local_3e0);
    } while (local_3e0 != &local_208);
    std::allocator<char>::~allocator(&local_216);
    std::allocator<char>::~allocator(&local_215);
    std::allocator<char>::~allocator(&local_214);
    std::allocator<char>::~allocator(&local_213);
    std::allocator<char>::~allocator(&local_212);
    std::allocator<char>::~allocator(&local_211);
  }
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)&__range1);
  return;
}

Assistant:

void TikzPlotter::addPoint(const Point2D &point_2d) {
    StyleMap style_map;

    // check which styles apply
    for(const auto& style_ptr : point_2d.style_ptrs) {
      if(style_ptr->conditionFulfilled(point_2d.flag_ptrs)) {
        style_ptr->applyStyle(style_map);
      }
    }

    // add the point based on style_map final state
    if(style_map.find("draw") != style_map.end() || style_map.find("fill") != style_map.end()) {
      content << R"(\path[)" 
        << getStyleMapString(style_map, {"draw", "draw opacity", "fill", "fill opacity", "line width", "*point_path"})
        << "] " 
        << point_2d 
        << "circle [" 
        << getStyleMapString(style_map, {"radius", "*point_circle"})
        << "];" 
        << std::endl;
    }
  }